

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stop.c
# Opt level: O3

int equal_stop(stop_t *a,stop_t *b)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  
  iVar1 = strcmp(a->id,b->id);
  uVar2 = 0;
  uVar3 = 0;
  if (iVar1 == 0) {
    iVar1 = strcmp(a->code,b->code);
    if (iVar1 == 0) {
      iVar1 = strcmp(a->name,b->name);
      if (iVar1 == 0) {
        iVar1 = strcmp(a->desc,b->desc);
        uVar2 = uVar3;
        if (iVar1 == 0) {
          iVar1 = strcmp(a->zone_id,b->zone_id);
          if (iVar1 == 0) {
            iVar1 = strcmp(a->url,b->url);
            if (iVar1 == 0) {
              iVar1 = strcmp(a->parent_station,b->parent_station);
              if (iVar1 == 0) {
                iVar1 = strcmp(a->timezone,b->timezone);
                if (iVar1 == 0) {
                  iVar1 = strcmp(a->level_id,b->level_id);
                  if (iVar1 == 0) {
                    iVar1 = strcmp(a->platform_code,b->platform_code);
                    if ((((iVar1 == 0) && (a->lat == b->lat)) && (!NAN(a->lat) && !NAN(b->lat))) &&
                       (((a->lon == b->lon && (!NAN(a->lon) && !NAN(b->lon))) &&
                        (a->location_type == b->location_type)))) {
                      uVar2 = (uint)(a->wheelchair_boarding == b->wheelchair_boarding);
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return uVar2;
}

Assistant:

int equal_stop(const stop_t *a, const stop_t *b) {
    return (!strcmp(a->id, b->id) &&
             !strcmp(a->code, b->code) &&
             !strcmp(a->name, b->name) &&
             !strcmp(a->desc, b->desc) &&
             !strcmp(a->zone_id, b->zone_id) &&
             !strcmp(a->url, b->url) &&
             !strcmp(a->parent_station, b->parent_station) &&
             !strcmp(a->timezone, b->timezone) &&
             !strcmp(a->level_id, b->level_id) &&
             !strcmp(a->platform_code, b->platform_code) &&
             a->lat == b->lat &&
             a->lon == b->lon &&
             a->location_type == b->location_type &&
             a->wheelchair_boarding == b->wheelchair_boarding);
}